

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O1

void __thiscall
QStringMatcher::QStringMatcher(QStringMatcher *this,QString *pattern,CaseSensitivity cs)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QStringView needle;
  
  this->d_ptr = (QStringMatcherPrivate *)0x0;
  this->q_cs = cs;
  pDVar1 = (pattern->d).d;
  (this->q_pattern).d.d = pDVar1;
  (this->q_pattern).d.ptr = (pattern->d).ptr;
  (this->q_pattern).d.size = (pattern->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  memset(&this->q_sv,0,0x110);
  pcVar2 = (this->q_pattern).d.ptr;
  qVar3 = (this->q_pattern).d.size;
  (this->q_sv).m_size = qVar3;
  (this->q_sv).m_data = pcVar2;
  needle.m_data = pcVar2;
  needle.m_size = qVar3;
  bm_init_skiptable(needle,this->q_skiptable,this->q_cs);
  return;
}

Assistant:

QStringMatcher::QStringMatcher(const QString &pattern, Qt::CaseSensitivity cs)
    : d_ptr(nullptr), q_cs(cs), q_pattern(pattern)
{
    q_sv = q_pattern;
    updateSkipTable();
}